

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall pbrt::RealisticCamera::TestExitPupilBounds(RealisticCamera *this)

{
  float fVar1;
  Bounds2<float> *pBVar2;
  size_t sVar3;
  float sx;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  Float FVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM5 [64];
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  Ray testOut;
  float local_e8;
  float local_d8;
  float local_a8;
  float local_98;
  undefined1 local_80 [32];
  MediumHandle local_60;
  Ray local_58;
  
  auVar30 = in_ZMM5._0_16_;
  auVar22 = in_ZMM0._0_16_;
  fVar1 = *(float *)(((this->super_CameraBase).film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff) +
                    0x20);
  if (TestExitPupilBounds()::rng == '\0') {
    TestExitPupilBounds();
  }
  uVar9 = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 * 0x5851f42d4c957f2d +
          0xda3e39cb94b95bdb;
  if (_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_1 == '\0') {
    uVar9 = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 * 0x5851f42d4c957f2d;
  }
  uVar8 = (uint)(_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 >> 0x2d) ^
          (uint)(_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 >> 0x1b);
  bVar11 = (byte)(_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 >> 0x3b);
  auVar22 = vcvtusi2ss_avx512f(auVar22,uVar8 >> bVar11 | uVar8 << 0x20 - bVar11);
  auVar22 = vminss_avx(ZEXT416((uint)(auVar22._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
  sx = fVar1 * auVar22._0_4_ * 0.5;
  pBVar2 = (this->exitPupilBounds).ptr;
  sVar3 = (this->exitPupilBounds).nStored;
  iVar14 = (int)sVar3;
  iVar13 = iVar14 + -1;
  auVar22 = vcvtusi2ss_avx512f(auVar30,sVar3 - 1);
  auVar22 = ZEXT416((uint)((sx / (fVar1 * 0.5)) * auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,9);
  iVar15 = (int)auVar22._0_4_;
  if (iVar13 < (int)auVar22._0_4_) {
    iVar15 = iVar13;
  }
  auVar30._8_8_ = 0;
  auVar30._0_8_ = pBVar2[iVar15].pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = pBVar2[iVar15].pMax.super_Tuple2<pbrt::Point2,_float>;
  iVar13 = iVar15 + 1;
  if (iVar13 < iVar14) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = pBVar2[iVar13].pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = pBVar2[iVar13].pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar30 = vminps_avx(auVar23,auVar30);
    auVar22 = vmaxps_avx(auVar28,auVar22);
  }
  auVar23 = vmovshdup_avx(auVar30);
  auVar28 = vmovshdup_avx(auVar22);
  iVar14 = 1000;
  _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 = uVar9;
  do {
    lVar12 = 0;
    if (_ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_1 != '\0') {
      lVar12 = -0x25c1c6346b46a425;
    }
    uVar9 = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 * 0x5851f42d4c957f2d + lVar12;
    uVar10 = uVar9 * 0x5851f42d4c957f2d + lVar12;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar9;
    auVar25 = vpunpcklqdq_avx(auVar24,auVar29);
    auVar18 = vpsrlvq_avx2(auVar25,_DAT_005655c0);
    auVar19 = vpsrlvq_avx2(auVar25,_DAT_005655d0);
    auVar18 = vpshufd_avx(auVar18 ^ auVar19,0xe8);
    auVar25 = vpsrlq_avx(auVar25,0x3b);
    auVar25 = vpshufd_avx(auVar25,0xe8);
    auVar18 = vprorvd_avx512vl(auVar18,auVar25);
    auVar25 = vcvtudq2ps_avx512vl(auVar18);
    auVar18._8_4_ = 0x2f800000;
    auVar18._0_8_ = 0x2f8000002f800000;
    auVar18._12_4_ = 0x2f800000;
    auVar18 = vmulps_avx512vl(auVar25,auVar18);
    auVar25._8_4_ = 0x3f7fffff;
    auVar25._0_8_ = 0x3f7fffff3f7fffff;
    auVar25._12_4_ = 0x3f7fffff;
    auVar18 = vminps_avx512vl(auVar18,auVar25);
    auVar26._0_4_ = auVar18._0_4_ + auVar18._0_4_;
    auVar26._4_4_ = auVar18._4_4_ + auVar18._4_4_;
    auVar26._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    auVar26._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    auVar19._8_4_ = 0xbf800000;
    auVar19._0_8_ = 0xbf800000bf800000;
    auVar19._12_4_ = 0xbf800000;
    auVar25 = vaddps_avx512vl(auVar26,auVar19);
    auVar18 = vmovshdup_avx(auVar25);
    fVar20 = auVar25._0_4_;
    fVar17 = auVar18._0_4_;
    _ZZNK4pbrt15RealisticCamera19TestExitPupilBoundsEvE3rng_0 = uVar10;
    if (fVar20 == 0.0) {
      auVar18 = (undefined1  [16])0x0;
      if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_0033747f;
    }
    else {
LAB_0033747f:
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx512vl(auVar25,auVar4);
      auVar18 = vshufps_avx(auVar19,auVar19,0xf5);
      bVar7 = auVar18._0_4_ < auVar19._0_4_;
      auVar27._0_4_ = fVar20 / fVar17;
      auVar27._4_12_ = auVar25._4_12_;
      auVar18 = vfmadd132ss_fma(auVar27,SUB6416(ZEXT464(0x3fc90fdb),0),ZEXT416(0xbf490fdb));
      fVar16 = (float)((uint)bVar7 * (int)((fVar17 / fVar20) * 0.7853982) +
                      (uint)!bVar7 * auVar18._0_4_);
      fVar17 = (float)((uint)bVar7 * (int)fVar20 + (uint)!bVar7 * (int)fVar17);
      fVar20 = cosf(fVar16);
      fVar16 = sinf(fVar16);
      auVar18 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar20)),ZEXT416((uint)(fVar17 * fVar16)),0x10
                             );
    }
    fVar17 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
    fVar20 = auVar18._0_4_ * fVar17;
    auVar18 = vmovshdup_avx(auVar18);
    fVar17 = auVar18._0_4_ * fVar17;
    local_80._0_8_ = vmovlps_avx(ZEXT416((uint)sx));
    local_80._8_4_ = 0.0;
    local_80._12_16_ = vinsertps_avx(ZEXT416((uint)(fVar20 - sx)),ZEXT416((uint)fVar17),0x1c);
    local_60.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    local_58.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    local_58._16_12_ = SUB1612(ZEXT816(0),0);
    local_58.o.super_Tuple3<pbrt::Point3,_float> =
         (Tuple3<pbrt::Point3,_float>)((undefined1  [12])local_58._16_12_ << 0x20);
    local_58.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    FVar21 = TraceLensesFromFilm(this,(Ray *)local_80,&local_58);
    local_98 = auVar22._0_4_;
    local_a8 = auVar30._0_4_;
    if ((FVar21 != 0.0) || (NAN(FVar21))) {
      local_d8 = auVar23._0_4_;
      local_e8 = auVar28._0_4_;
      if ((fVar20 < local_a8) ||
         (((local_98 < fVar20 || (fVar17 < local_d8)) || (local_e8 < fVar17)))) {
        fprintf(_stderr,"Aha! (%f,%f) went through, but outside bounds (%f,%f) - (%f,%f)\n",
                (double)fVar20,(double)fVar17,(double)local_a8,(double)local_d8,(double)local_98,
                (double)local_e8);
        auVar5._4_4_ = in_XMM6_Db;
        auVar5._0_4_ = in_XMM6_Da;
        auVar5._8_8_ = in_XMM6_Qb;
        auVar22 = vcvtusi2ss_avx512f(auVar5,(this->exitPupilBounds).nStored);
        RenderExitPupil(this,((float)iVar15 / auVar22._0_4_) * fVar1 * 0.5,0.0,"low.exr");
        auVar6._4_4_ = in_XMM6_Db;
        auVar6._0_4_ = in_XMM6_Da;
        auVar6._8_8_ = in_XMM6_Qb;
        auVar22 = vcvtusi2ss_avx512f(auVar6,(this->exitPupilBounds).nStored);
        RenderExitPupil(this,((float)iVar13 / auVar22._0_4_) * fVar1 * 0.5,0.0,"high.exr");
        RenderExitPupil(this,sx,0.0,"mid.exr");
        exit(0);
      }
    }
    iVar14 = iVar14 + -1;
    if (iVar14 == 0) {
      fputc(0x2e,_stderr);
      return;
    }
  } while( true );
}

Assistant:

void RealisticCamera::TestExitPupilBounds() const {
    Float filmDiagonal = film.Diagonal();

    static RNG rng;

    Float u = rng.Uniform<Float>();
    Point3f pFilm(u * filmDiagonal / 2, 0, 0);

    Float r = pFilm.x / (filmDiagonal / 2);
    int pupilIndex = std::min<int>(exitPupilBounds.size() - 1,
                                   std::floor(r * (exitPupilBounds.size() - 1)));
    Bounds2f pupilBounds = exitPupilBounds[pupilIndex];
    if (pupilIndex + 1 < (int)exitPupilBounds.size())
        pupilBounds = Union(pupilBounds, exitPupilBounds[pupilIndex + 1]);

    // Now, randomly pick points on the aperture and see if any are outside
    // of pupil bounds...
    for (int i = 0; i < 1000; ++i) {
        Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Point2f pd = SampleUniformDiskConcentric(u2);
        pd *= RearElementRadius();

        Ray testRay(pFilm, Point3f(pd.x, pd.y, 0.f) - pFilm);
        Ray testOut;
        if (!TraceLensesFromFilm(testRay, &testOut))
            continue;

        if (!Inside(pd, pupilBounds)) {
            fprintf(stderr,
                    "Aha! (%f,%f) went through, but outside bounds (%f,%f) - "
                    "(%f,%f)\n",
                    pd.x, pd.y, pupilBounds.pMin[0], pupilBounds.pMin[1],
                    pupilBounds.pMax[0], pupilBounds.pMax[1]);
            RenderExitPupil(
                (Float)pupilIndex / exitPupilBounds.size() * filmDiagonal / 2.f, 0.f,
                "low.exr");
            RenderExitPupil(
                (Float)(pupilIndex + 1) / exitPupilBounds.size() * filmDiagonal / 2.f,
                0.f, "high.exr");
            RenderExitPupil(pFilm.x, 0.f, "mid.exr");
            exit(0);
        }
    }
    fprintf(stderr, ".");
}